

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderTests.cpp
# Opt level: O3

void deqp::egl::anon_unknown_4::randomizeDrawOp(Random *rnd,DrawPrimitiveOp *drawOp)

{
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> *this;
  pointer pVVar1;
  pointer pVVar2;
  deUint32 dVar3;
  DepthMode DVar4;
  StencilMode SVar5;
  int iVar6;
  int iVar7;
  pointer pVVar8;
  long lVar9;
  pointer pVVar10;
  int coordNdx;
  int iVar11;
  long lVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  deRandom_getUint32(&rnd->m_rnd);
  drawOp->type = PRIMITIVETYPE_TRIANGLE;
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->count = dVar3 % 3 + 2;
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->blend = dVar3 % 3;
  DVar4 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->depth = DVar4 & DEPTHMODE_LESS;
  SVar5 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->stencil = SVar5 & STENCILMODE_LEQUAL_INC;
  dVar3 = deRandom_getUint32(&rnd->m_rnd);
  drawOp->stencilRef = dVar3 % 9;
  if (drawOp->type == PRIMITIVETYPE_TRIANGLE) {
    this = &drawOp->positions;
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (this,(long)(drawOp->count * 3));
    std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::resize
              (&drawOp->colors,(long)(drawOp->count * 3));
    if (0 < drawOp->count) {
      iVar7 = 0;
      lVar9 = 0;
      do {
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        fVar17 = fVar13 + fVar13 + -1.0;
        fVar13 = deRandom_getFloat(&rnd->m_rnd);
        fVar13 = fVar13 + fVar13 + -1.0;
        iVar11 = (int)lVar9 * 3;
        lVar12 = 0;
        do {
          iVar6 = iVar7 + (int)lVar12;
          pVVar1 = (this->
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          pVVar2 = (drawOp->colors).
                   super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar1[iVar6].m_data[0] = fVar14 + fVar14 + -1.0 + fVar17;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar1[iVar6].m_data[1] = fVar14 + fVar14 + -1.0 + fVar13;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar1[iVar6].m_data[2] = fVar14 + fVar14 + -1.0;
          pVVar1[iVar6].m_data[3] = 1.0;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar2[iVar6].m_data[0] = fVar14 * 0.7 + 0.2;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar2[iVar6].m_data[1] = fVar14 * 0.7 + 0.2;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar2[iVar6].m_data[2] = fVar14 * 0.7 + 0.2;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar2[iVar6].m_data[3] = fVar14 * 0.7 + 0.3;
          lVar12 = lVar12 + 1;
        } while (lVar12 != 3);
        pVVar2 = (this->
                 super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>)
                 ._M_impl.super__Vector_impl_data._M_start;
        pVVar8 = pVVar2 + iVar11;
        pVVar10 = pVVar2 + (iVar11 + 1);
        pVVar1 = pVVar2 + (iVar11 + 2);
        fVar14 = pVVar2[iVar11 + 2].m_data[3];
        iVar11 = 0x29;
        do {
          auVar15._4_4_ = pVVar8->m_data[0];
          auVar15._0_4_ = pVVar10->m_data[0];
          auVar15._8_8_ = 0;
          auVar16._4_4_ = pVVar8->m_data[3];
          auVar16._0_4_ = pVVar10->m_data[3];
          auVar16._8_8_ = 0;
          auVar16 = divps(auVar15,auVar16);
          auVar19._4_4_ = pVVar8->m_data[1];
          auVar19._0_4_ = pVVar1->m_data[1];
          auVar19._8_8_ = 0;
          auVar20._4_4_ = pVVar8->m_data[3];
          auVar20._0_4_ = fVar14;
          auVar20._8_8_ = 0;
          auVar20 = divps(auVar19,auVar20);
          fVar18 = (auVar20._0_4_ - auVar20._4_4_) * (auVar16._0_4_ - auVar16._4_4_) -
                   (pVVar1->m_data[0] / fVar14 - auVar16._4_4_) *
                   (pVVar10->m_data[1] / pVVar10->m_data[3] - auVar20._4_4_);
          fVar14 = -fVar18;
          if (-fVar18 <= fVar18) {
            fVar14 = fVar18;
          }
          if (0.4 <= fVar14 * 0.5) break;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar10->m_data[0] = fVar14 + fVar14 + -1.0 + fVar17;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar10->m_data[1] = fVar14 + fVar14 + -1.0 + fVar13;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar10->m_data[2] = fVar14 + fVar14 + -1.0;
          pVVar10->m_data[3] = 1.0;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar1->m_data[0] = fVar14 + fVar14 + -1.0 + fVar17;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar1->m_data[1] = fVar14 + fVar14 + -1.0 + fVar13;
          fVar14 = deRandom_getFloat(&rnd->m_rnd);
          pVVar1->m_data[2] = fVar14 + fVar14 + -1.0;
          pVVar1->m_data[3] = 1.0;
          fVar14 = 1.0;
          iVar11 = iVar11 + -1;
        } while (iVar11 != 0);
        lVar9 = lVar9 + 1;
        iVar7 = iVar7 + 3;
      } while (lVar9 < drawOp->count);
    }
  }
  return;
}

Assistant:

void randomizeDrawOp (de::Random& rnd, DrawPrimitiveOp& drawOp)
{
	const int	minStencilRef	= 0;
	const int	maxStencilRef	= 8;
	const int	minPrimitives	= 2;
	const int	maxPrimitives	= 4;

	const float	maxTriOffset	= 1.0f;
	const float	minDepth		= -1.0f; // \todo [pyry] Reference doesn't support Z clipping yet
	const float	maxDepth		= 1.0f;

	const float	minRGB			= 0.2f;
	const float	maxRGB			= 0.9f;
	const float	minAlpha		= 0.3f;
	const float	maxAlpha		= 1.0f;

	drawOp.type			= (PrimitiveType)rnd.getInt(0, PRIMITIVETYPE_LAST-1);
	drawOp.count		= rnd.getInt(minPrimitives, maxPrimitives);
	drawOp.blend		= (BlendMode)rnd.getInt(0, BLENDMODE_LAST-1);
	drawOp.depth		= (DepthMode)rnd.getInt(0, DEPTHMODE_LAST-1);
	drawOp.stencil		= (StencilMode)rnd.getInt(0, STENCILMODE_LAST-1);
	drawOp.stencilRef	= rnd.getInt(minStencilRef, maxStencilRef);

	if (drawOp.type == PRIMITIVETYPE_TRIANGLE)
	{
		drawOp.positions.resize(drawOp.count*3);
		drawOp.colors.resize(drawOp.count*3);

		for (int triNdx = 0; triNdx < drawOp.count; triNdx++)
		{
			const float		cx		= rnd.getFloat(-1.0f, 1.0f);
			const float		cy		= rnd.getFloat(-1.0f, 1.0f);

			for (int coordNdx = 0; coordNdx < 3; coordNdx++)
			{
				tcu::Vec4&	position	= drawOp.positions[triNdx*3 + coordNdx];
				tcu::Vec4&	color		= drawOp.colors[triNdx*3 + coordNdx];

				position.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
				position.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
				position.z()	= rnd.getFloat(minDepth, maxDepth);
				position.w()	= 1.0f;

				color.x()		= rnd.getFloat(minRGB, maxRGB);
				color.y()		= rnd.getFloat(minRGB, maxRGB);
				color.z()		= rnd.getFloat(minRGB, maxRGB);
				color.w()		= rnd.getFloat(minAlpha, maxAlpha);
			}

			// avoid generating narrow triangles
			{
				const int	maxAttempts	= 40;
				int			numAttempts	= 0;
				tcu::Vec4&	p0			= drawOp.positions[triNdx*3 + 0];
				tcu::Vec4&	p1			= drawOp.positions[triNdx*3 + 1];
				tcu::Vec4&	p2			= drawOp.positions[triNdx*3 + 2];

				while (isANarrowScreenSpaceTriangle(p0, p1, p2))
				{
					p1.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p1.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p1.z()	= rnd.getFloat(minDepth, maxDepth);
					p1.w()	= 1.0f;

					p2.x()	= cx + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p2.y()	= cy + rnd.getFloat(-maxTriOffset, maxTriOffset);
					p2.z()	= rnd.getFloat(minDepth, maxDepth);
					p2.w()	= 1.0f;

					if (++numAttempts > maxAttempts)
					{
						DE_ASSERT(false);
						break;
					}
				}
			}
		}
	}
	else
		DE_ASSERT(false);
}